

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opl_mididevice.cpp
# Opt level: O0

void __thiscall OPLMIDIDevice::OPLMIDIDevice(OPLMIDIDevice *this,char *args)

{
  bool bVar1;
  undefined1 local_60 [8];
  FWadLump data;
  char *args_local;
  OPLMIDIDevice *this_local;
  
  SoftSynthMIDIDevice::SoftSynthMIDIDevice(&this->super_SoftSynthMIDIDevice);
  OPLmusicBlock::OPLmusicBlock(&this->super_OPLmusicBlock);
  (this->super_SoftSynthMIDIDevice).super_MIDIDevice._vptr_MIDIDevice =
       (_func_int **)&PTR__OPLMIDIDevice_009efa68;
  (this->super_OPLmusicBlock)._vptr_OPLmusicBlock = (_func_int **)&PTR__OPLMIDIDevice_009efb70;
  OPL_SetCore(args);
  bVar1 = FBoolCVar::operator_cast_to_bool(&opl_fullpan);
  (this->super_OPLmusicBlock).FullPan = bVar1;
  FWadCollection::OpenLumpName((FWadLump *)local_60,&Wads,"GENMIDI");
  musicBlock::OPLloadBank(&(this->super_OPLmusicBlock).super_musicBlock,(FileReader *)local_60);
  (this->super_SoftSynthMIDIDevice).SampleRate = 0xc234;
  FWadLump::~FWadLump((FWadLump *)local_60);
  return;
}

Assistant:

OPLMIDIDevice::OPLMIDIDevice(const char *args)
{
	OPL_SetCore(args);
	FullPan = opl_fullpan;
	FWadLump data = Wads.OpenLumpName("GENMIDI");
	OPLloadBank(data);
	SampleRate = (int)OPL_SAMPLE_RATE;
}